

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renumberCursorsCb(Walker *pWalker,Expr *pExpr)

{
  int op;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if ((pExpr->op == 0xa7) || (pExpr->op == 0xb3)) {
    renumberCursorDoMapping(pWalker,&pExpr->iTable);
  }
  if ((pExpr->flags & 1) != 0) {
    renumberCursorDoMapping(pWalker,&(pExpr->w).iJoin);
  }
  return 0;
}

Assistant:

static int renumberCursorsCb(Walker *pWalker, Expr *pExpr){
  int op = pExpr->op;
  if( op==TK_COLUMN || op==TK_IF_NULL_ROW ){
    renumberCursorDoMapping(pWalker, &pExpr->iTable);
  }
  if( ExprHasProperty(pExpr, EP_OuterON) ){
    renumberCursorDoMapping(pWalker, &pExpr->w.iJoin);
  }
  return WRC_Continue;
}